

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall
LoopCrosser::HasCrossing(LoopCrosser *this,RangeIterator_conflict *ai,RangeIterator_conflict *bi)

{
  pointer ppSVar1;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  bool bVar2;
  int iVar3;
  S2ClippedShape *pSVar4;
  const_reference b_clipped;
  int iVar5;
  pointer ppSVar6;
  bool bVar7;
  S2LogMessage local_48;
  S2CellId local_38;
  
  local_38.id_ = (ai->it_).super_IteratorBase.id_.id_;
  bVar2 = S2CellId::contains(&local_38,(S2CellId)(bi->it_).super_IteratorBase.id_.id_);
  if (!bVar2) {
    S2LogMessage::S2LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x38e,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_48.stream_,"Check failed: ai->id().contains(bi->id()) ");
    abort();
  }
  ppSVar6 = (this->b_cells_).
            super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->b_cells_).
      super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppSVar6) {
    (this->b_cells_).
    super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar6;
  }
  iVar5 = 0;
  do {
    iVar3 = RangeIterator::num_edges((RangeIterator *)bi);
    if (0 < iVar3) {
      iVar3 = RangeIterator::num_edges((RangeIterator *)bi);
      iVar5 = iVar3 + iVar5;
      if (0x13 < iVar5) {
        pSVar4 = RangeIterator::clipped((RangeIterator *)ai);
        bVar2 = CellCrossesAnySubcell(this,pSVar4,(S2CellId)(ai->it_).super_IteratorBase.id_.id_);
        if (bVar2) {
          return true;
        }
        RangeIterator::SeekBeyond((RangeIterator *)bi,ai);
        return false;
      }
      local_48._0_8_ = (bi->it_).super_IteratorBase.cell_._M_b._M_p;
      std::vector<S2ShapeIndexCell_const*,std::allocator<S2ShapeIndexCell_const*>>::
      emplace_back<S2ShapeIndexCell_const*>
                ((vector<S2ShapeIndexCell_const*,std::allocator<S2ShapeIndexCell_const*>> *)
                 &this->b_cells_,(S2ShapeIndexCell **)&local_48);
    }
    RangeIterator::Next((RangeIterator *)bi);
  } while ((bi->it_).super_IteratorBase.id_.id_ <= (ai->range_max_).id_);
  ppSVar6 = (this->b_cells_).
            super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->b_cells_).
            super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar7 = ppSVar6 == ppSVar1;
    bVar2 = !bVar7;
    if (bVar7) {
      return bVar2;
    }
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)*ppSVar6;
    pSVar4 = RangeIterator::clipped((RangeIterator *)ai);
    b_clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                          (this_00,0);
    bVar7 = CellCrossesCell(this,pSVar4,b_clipped);
    ppSVar6 = ppSVar6 + 1;
  } while (!bVar7);
  return bVar2;
}

Assistant:

bool LoopCrosser::HasCrossing(RangeIterator* ai, RangeIterator* bi) {
  S2_DCHECK(ai->id().contains(bi->id()));
  // If ai->id() intersects many edges of B, then it is faster to use
  // S2CrossingEdgeQuery to narrow down the candidates.  But if it intersects
  // only a few edges, it is faster to check all the crossings directly.
  // We handle this by advancing "bi" and keeping track of how many edges we
  // would need to test.

  static const int kEdgeQueryMinEdges = 20;  // Tuned using benchmarks.
  int total_edges = 0;
  b_cells_.clear();
  do {
    if (bi->num_edges() > 0) {
      total_edges += bi->num_edges();
      if (total_edges >= kEdgeQueryMinEdges) {
        // There are too many edges to test them directly, so use
        // S2CrossingEdgeQuery.
        if (CellCrossesAnySubcell(ai->clipped(), ai->id())) return true;
        bi->SeekBeyond(*ai);
        return false;
      }
      b_cells_.push_back(&bi->cell());
    }
    bi->Next();
  } while (bi->id() <= ai->range_max());

  // Test all the edge crossings directly.
  for (const S2ShapeIndexCell* b_cell : b_cells_) {
    if (CellCrossesCell(ai->clipped(), b_cell->clipped(0))) {
      return true;
    }
  }
  return false;
}